

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O0

w_status wp_token_scan_binary_int(w_tokenizer *tokenizer,w_token_id *id)

{
  int iVar1;
  w_token_id *id_local;
  w_tokenizer *tokenizer_local;
  
  if (tokenizer == (w_tokenizer *)0x0) {
    w_handle_failed_assertion
              ("tokenizer != NULL","wp_token_scan_binary_int",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xe2);
  }
  if (tokenizer->it == (char *)0x0) {
    w_handle_failed_assertion
              ("tokenizer->it != NULL","wp_token_scan_binary_int",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xe3);
  }
  if (tokenizer->it[-2] != '0') {
    w_handle_failed_assertion
              ("tokenizer->it[-2] == \'0\'","wp_token_scan_binary_int",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xe4);
  }
  if (tokenizer->it[-1] != 'b') {
    w_handle_failed_assertion
              ("tokenizer->it[-1] == \'b\'","wp_token_scan_binary_int",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xe5);
  }
  if (id == (w_token_id *)0x0) {
    w_handle_failed_assertion
              ("id != NULL","wp_token_scan_binary_int",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0xe6);
  }
  iVar1 = (int)*tokenizer->it;
  if ((((*tokenizer->it == '\0') || (iVar1 == 10)) || (iVar1 == 0x20)) ||
     (((iVar1 - 0x2aU < 2 || (iVar1 == 0x2d)) || (iVar1 == 0x2f)))) {
    tokenizer_local._4_4_ = wp_token_add_error(tokenizer,"unterminated binary integer literal");
  }
  else if (iVar1 == 0x30 || iVar1 == 0x31) {
    wp_token_advance_iter(tokenizer);
    wp_token_consume_binary_digits(tokenizer);
    iVar1 = (int)*tokenizer->it;
    if (((*tokenizer->it == '\0') || (iVar1 == 10)) ||
       ((iVar1 == 0x20 || (((iVar1 - 0x2aU < 2 || (iVar1 == 0x2d)) || (iVar1 == 0x2f)))))) {
      *id = W_TOKEN_ID_INT_BINARY;
      tokenizer_local._4_4_ = W_SUCCESS;
    }
    else {
      tokenizer_local._4_4_ =
           wp_token_add_error(tokenizer,"not a valid binary integer literal character");
    }
  }
  else {
    tokenizer_local._4_4_ =
         wp_token_add_error(tokenizer,"not a valid binary integer literal character");
  }
  return tokenizer_local._4_4_;
}

Assistant:

static enum w_status
wp_token_scan_binary_int(
    struct w_tokenizer *tokenizer,
    enum w_token_id *id
)
{
    W_ASSERT(tokenizer != NULL);
    W_ASSERT(tokenizer->it != NULL);
    W_ASSERT(tokenizer->it[-2] == '0');
    W_ASSERT(tokenizer->it[-1] == 'b');
    W_ASSERT(id != NULL);

    switch (*tokenizer->it)
    {
        case WP_TOKEN_CASE_BINARY_DIGITS:
        {
            wp_token_advance_iter(tokenizer);
            wp_token_consume_binary_digits(tokenizer);
            switch (*tokenizer->it)
            {
                case WP_TOKEN_CASE_VALID_FOLLOW_UP_TO_NUMBER_LITERAL:
                {
                    *id = W_TOKEN_ID_INT_BINARY;
                    return W_SUCCESS;
                }
                default:
                {
                    return wp_token_add_error(
                        tokenizer,
                        WP_TOKEN_GET_ERROR_MSG_INVALID_CHAR(
                            "binary integer literal"
                        )
                    );
                }
            }
        }
        case WP_TOKEN_CASE_VALID_FOLLOW_UP_TO_NUMBER_LITERAL:
        {
            return wp_token_add_error(
                tokenizer,
                WP_TOKEN_GET_ERROR_MSG_UNTERMINATED("binary integer literal")
            );
        }
        default:
        {
            return wp_token_add_error(
                tokenizer,
                WP_TOKEN_GET_ERROR_MSG_INVALID_CHAR("binary integer literal")
            );
        }
    }
}